

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O3

VRDatumPtr __thiscall MinVR::CreateVRDatumIntArray(MinVR *this,void *pData)

{
  VRDatumIntArray *this_00;
  undefined4 *puVar1;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar2;
  vector<int,_std::allocator<int>_> local_30;
  
  this_00 = (VRDatumIntArray *)operator_new(0x68);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_30,(vector<int,_std::allocator<int>_> *)pData);
  VRDatumIntArray::VRDatumIntArray(this_00,&local_30);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  *(VRDatumIntArray **)this = this_00;
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 1;
  *(undefined4 **)(this + 8) = puVar1;
  VVar2.reference = extraout_RDX;
  VVar2.pData = (VRDatum_conflict *)this;
  return VVar2;
}

Assistant:

VRDatumPtr CreateVRDatumIntArray(void *pData) {
  VRDatumIntArray *obj =
    new VRDatumIntArray(*static_cast<VRIntArray *>(pData));
  return VRDatumPtr(obj);
}